

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void crnlib::vector<crnlib::unique_color_projection>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  unique_color_projection *local_38;
  unique_color_projection *pDst;
  unique_color_projection *pSrc_end;
  unique_color_projection *pSrc;
  uint num_local;
  void *pSrc_void_local;
  void *pDst_void_local;
  
  local_38 = (unique_color_projection *)pDst_void;
  for (pSrc_end = (unique_color_projection *)pSrc_void;
      pSrc_end != (unique_color_projection *)((long)pSrc_void + (ulong)num * 0x10);
      pSrc_end = pSrc_end + 1) {
    unique_color_projection::unique_color_projection(local_38,pSrc_end);
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }